

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_pointer.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_b8 [8];
  IncreaseDefenseModifier rt2;
  DoubleAttackModifier rt1;
  CreatureModifier root;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  Creature goblin;
  
  goblin.defense = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Goblin",&local_59);
  Creature::Creature((Creature *)local_38,&local_58,10,0xd);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  CreatureModifier::CreatureModifier
            ((CreatureModifier *)&rt1.super_CreatureModifier.creature,(Creature *)local_38);
  DoubleAttackModifier::DoubleAttackModifier
            ((DoubleAttackModifier *)&rt2.super_CreatureModifier.creature,(Creature *)local_38);
  IncreaseDefenseModifier::IncreaseDefenseModifier
            ((IncreaseDefenseModifier *)local_b8,(Creature *)local_38);
  CreatureModifier::add
            ((CreatureModifier *)&rt1.super_CreatureModifier.creature,
             (CreatureModifier *)&rt2.super_CreatureModifier.creature);
  CreatureModifier::add
            ((CreatureModifier *)&rt1.super_CreatureModifier.creature,(CreatureModifier *)local_b8);
  CreatureModifier::handle((CreatureModifier *)&rt1.super_CreatureModifier.creature);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  goblin.defense = 0;
  IncreaseDefenseModifier::~IncreaseDefenseModifier((IncreaseDefenseModifier *)local_b8);
  DoubleAttackModifier::~DoubleAttackModifier
            ((DoubleAttackModifier *)&rt2.super_CreatureModifier.creature);
  CreatureModifier::~CreatureModifier((CreatureModifier *)&rt1.super_CreatureModifier.creature);
  Creature::~Creature((Creature *)local_38);
  return goblin.defense;
}

Assistant:

int main()
{
	Creature goblin{"Goblin", 10, 13};
	std::cout << goblin << std::endl;

	CreatureModifier root{goblin};
	DoubleAttackModifier rt1{goblin};
	IncreaseDefenseModifier rt2{goblin};
	root.add(&rt1);
	root.add(&rt2);
	root.handle();

	std::cout << goblin << std::endl;
	return 0;
}